

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall
basisu::basisu_frontend::dump_endpoint_clusterization_visualization
          (basisu_frontend *this,char *pFilename,bool vis_endpoint_colors)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  uint32_t uVar1;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar2;
  uint uVar3;
  uint16_t c;
  vector<unsigned_int> *pvVar4;
  uint *puVar5;
  endpoint_cluster_etc_params *peVar6;
  etc_block *this_01;
  pixel_block *ppVar7;
  uint32_t i_2;
  uint32_t i_1;
  color_rgba *pBlock_colors;
  ulong uVar8;
  size_t i_00;
  uint uVar9;
  uint32_t i;
  ulong uVar10;
  long lVar11;
  ulong i_01;
  anon_union_8_2_04352b30_for_etc_block_0 local_e0;
  vector<unsigned_int> sorted_cluster_indices;
  vector<unsigned_int> cluster_sizes;
  color_rgba colors [2];
  image endpoint_cluster_vis;
  color_rgba subblock_pixels [8];
  color_rgba blk_colors [4];
  
  uVar9 = 0;
  debug_printf("dump_endpoint_clusterization_visualization\n");
  vector<unsigned_int>::vector(&cluster_sizes,(ulong)(this->m_endpoint_clusters).m_size);
  vector<unsigned_int>::vector(&sorted_cluster_indices,(ulong)(this->m_endpoint_clusters).m_size);
  this_00 = &this->m_endpoint_clusters;
  for (uVar10 = 0; uVar8 = (ulong)(this->m_endpoint_clusters).m_size, uVar10 < uVar8;
      uVar10 = uVar10 + 1) {
    pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar10);
    if (uVar9 <= pvVar4->m_size) {
      uVar9 = pvVar4->m_size;
    }
    pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar10);
    uVar1 = pvVar4->m_size;
    puVar5 = vector<unsigned_int>::operator[](&cluster_sizes,uVar10);
    *puVar5 = uVar1;
  }
  if (uVar9 != 0) {
    for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
      puVar5 = vector<unsigned_int>::operator[](&sorted_cluster_indices,uVar10);
      *puVar5 = (uint)uVar10;
      uVar8 = (ulong)(this->m_endpoint_clusters).m_size;
    }
    uVar3 = 0x800;
    if (uVar9 < 0x800) {
      uVar3 = uVar9;
    }
    image::image(&endpoint_cluster_vis,uVar3 * 5 + 0xc,(int)uVar8 * 3,0xffffffff);
    for (i_00 = 0; i_00 < (this->m_endpoint_clusters).m_size; i_00 = i_00 + 1) {
      puVar5 = vector<unsigned_int>::operator[](&sorted_cluster_indices,i_00);
      uVar10 = (ulong)*puVar5;
      local_e0.m_uint64 = 0x2000000;
      peVar6 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                         (&this->m_endpoint_cluster_etc_params,uVar10);
      etc_block::set_inten_tables_etc1s((etc_block *)&local_e0,peVar6->m_inten_table[0]);
      peVar6 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                         (&this->m_endpoint_cluster_etc_params,uVar10);
      c = etc_block::pack_color5(peVar6->m_color_unscaled,false,0x7f);
      etc_block::set_base5_color((etc_block *)&local_e0,c);
      pBlock_colors = blk_colors;
      etc_block::get_block_colors((etc_block *)&local_e0,pBlock_colors,0);
      uVar1 = (int)i_00 * 3;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 2) {
        image::fill_box(&endpoint_cluster_vis,(uint32_t)lVar11,uVar1,2,2,pBlock_colors);
        pBlock_colors = pBlock_colors + 1;
      }
      uVar8 = 0;
      while( true ) {
        pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar10);
        if (pvVar4->m_size <= uVar8) break;
        pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar10);
        puVar5 = vector<unsigned_int>::operator[](pvVar4,uVar8);
        uVar9 = *puVar5;
        i_01 = (ulong)(uVar9 >> 1);
        this_01 = vector<basisu::etc_block>::operator[](&this->m_etc1_blocks_etc1s,i_01);
        ppVar7 = vector<basisu::pixel_block>::operator[](&this->m_source_blocks,i_01);
        uVar9 = uVar9 & 1;
        if (vis_endpoint_colors) {
          etc_block::get_block_low_high_colors(this_01,colors,uVar9);
          aVar2 = colors[uVar9].field_0;
          for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
            subblock_pixels[lVar11].field_0 = aVar2;
          }
        }
        else {
          for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
            subblock_pixels[lVar11].field_0 =
                 ppVar7->m_pixels[0]
                 [*(uint *)(g_etc1_pixel_indices +
                           lVar11 * 4 +
                           (ulong)(((this_01->field_0).m_bytes[3] & 1) << 6) + (ulong)(uVar9 << 5))]
                 .field_0;
          }
        }
        image::set_block_clipped
                  (&endpoint_cluster_vis,subblock_pixels,(int)uVar8 * 5 + 0xc,uVar1,4,2);
        uVar8 = uVar8 + 1;
      }
    }
    save_png(pFilename,&endpoint_cluster_vis,0,0);
    debug_printf("Wrote debug visualization file %s\n",pFilename);
    free(endpoint_cluster_vis.m_pixels.m_p);
  }
  free(sorted_cluster_indices.m_p);
  free(cluster_sizes.m_p);
  return;
}

Assistant:

void basisu_frontend::dump_endpoint_clusterization_visualization(const char *pFilename, bool vis_endpoint_colors)
	{
		debug_printf("dump_endpoint_clusterization_visualization\n");

		uint32_t max_endpoint_cluster_size = 0;

		basisu::vector<uint32_t> cluster_sizes(m_endpoint_clusters.size());
		basisu::vector<uint32_t> sorted_cluster_indices(m_endpoint_clusters.size());
		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
		{
			max_endpoint_cluster_size = maximum<uint32_t>(max_endpoint_cluster_size, (uint32_t)m_endpoint_clusters[i].size());
			cluster_sizes[i] = (uint32_t)m_endpoint_clusters[i].size();
		}

		if (!max_endpoint_cluster_size)
			return;

		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
			sorted_cluster_indices[i] = i;

		//indexed_heap_sort(endpoint_clusters.size(), cluster_sizes.get_ptr(), sorted_cluster_indices.get_ptr());

		image endpoint_cluster_vis(12 + minimum<uint32_t>(max_endpoint_cluster_size, 2048) * 5, (uint32_t)m_endpoint_clusters.size() * 3);

		for (uint32_t unsorted_cluster_iter = 0; unsorted_cluster_iter < m_endpoint_clusters.size(); unsorted_cluster_iter++)
		{
			const uint32_t cluster_iter = sorted_cluster_indices[unsorted_cluster_iter];

			etc_block blk;
			blk.clear();
			blk.set_flip_bit(false);
			blk.set_diff_bit(true);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[cluster_iter].m_inten_table[0]);
			blk.set_base5_color(etc_block::pack_color5(m_endpoint_cluster_etc_params[cluster_iter].m_color_unscaled[0], false));

			color_rgba blk_colors[4];
			blk.get_block_colors(blk_colors, 0);
			for (uint32_t i = 0; i < 4; i++)
				endpoint_cluster_vis.fill_box(i * 2, 3 * unsorted_cluster_iter, 2, 2, blk_colors[i]);

			for (uint32_t subblock_iter = 0; subblock_iter < m_endpoint_clusters[cluster_iter].size(); subblock_iter++)
			{
				uint32_t training_vector_index = m_endpoint_clusters[cluster_iter][subblock_iter];

				const uint32_t block_index = training_vector_index >> 1;
				const uint32_t subblock_index = training_vector_index & 1;

				const etc_block& blk2 = m_etc1_blocks_etc1s[block_index];

				const color_rgba *pBlock_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba subblock_pixels[8];

				if (vis_endpoint_colors)
				{
					color_rgba colors[2];
					blk2.get_block_low_high_colors(colors, subblock_index);
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = colors[subblock_index];
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = pBlock_pixels[g_etc1_pixel_indices[blk2.get_flip_bit()][subblock_index][i]];
				}

				endpoint_cluster_vis.set_block_clipped(subblock_pixels, 12 + 5 * subblock_iter, 3 * unsorted_cluster_iter, 4, 2);
			}
		}

		save_png(pFilename, endpoint_cluster_vis);
		debug_printf("Wrote debug visualization file %s\n", pFilename);
	}